

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeInternalJacobianPreInt
          (ChElementBeamANCF_3243 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  Matrix<double,__1,__1,_0,__1,__1> *a_rhs;
  PointerType pdVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double *pdVar7;
  double *pdVar8;
  char *__function;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  double dVar43;
  undefined8 in_XMM0_Qb;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ChVectorN<double,_(NSF_*_(NSF___1))___2>_conflict ScaledMassMatrix;
  MatrixNxN K_K13Compact;
  Matrix3xN e_bar;
  ChMatrixNMc<double,_9,_NSF_*_NSF> K2;
  Matrix3xN e_bar_dot;
  ChMatrixNMc<double,_9,_NSF_*_NSF> PI2;
  CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_64,_0,_9,_64>_>
  *local_2960;
  Scalar local_2920;
  double dStack_2918;
  double dStack_2910;
  double dStack_2908;
  double local_2900;
  double dStack_28f8;
  double dStack_28f0;
  double dStack_28e8;
  double local_28e0;
  double dStack_28d8;
  double dStack_28d0;
  double dStack_28c8;
  double local_28c0;
  double dStack_28b8;
  double dStack_28b0;
  double dStack_28a8;
  double local_28a0;
  double dStack_2898;
  double dStack_2890;
  double dStack_2888;
  double local_2880;
  double dStack_2878;
  double dStack_2870;
  double dStack_2868;
  double local_2860;
  double dStack_2858;
  double dStack_2850;
  double dStack_2848;
  double local_2840;
  double dStack_2838;
  double dStack_2830;
  double dStack_2828;
  double local_2820;
  double dStack_2818;
  double dStack_2810;
  double dStack_2808;
  undefined1 local_2800 [8];
  double dStack_27f8;
  Matrix<double,__1,__1,_0,__1,__1> *local_27f0;
  double adStack_27e8 [61];
  undefined1 local_2600 [128];
  undefined1 local_2580 [56];
  double dStack_2548;
  Matrix<double,_9,_64,_0,_9,_64> local_2540;
  undefined1 local_1340 [64];
  undefined1 local_1300 [64];
  undefined1 local_12c0 [64];
  Matrix<double,_9,_64,_0,_9,_64> local_1280;
  
  CalcCoordMatrix(this,(Matrix3xN *)local_2600);
  CalcCoordDerivMatrix(this,(Matrix3xN *)local_1340);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = this->m_Alpha;
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = Rfactor;
  auVar37._8_8_ = in_XMM0_Qb;
  auVar37._0_8_ = Kfactor;
  auVar37 = vfmadd213sd_fma(auVar3,auVar44,auVar37);
  auVar38 = vbroadcastsd_avx512f(auVar37);
  auVar39 = vmulpd_avx512f(auVar38,local_2600._0_64_);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = this->m_Alpha * Kfactor;
  auVar40 = vbroadcastsd_avx512f(auVar45);
  auVar41 = vmulpd_avx512f(auVar40,local_1340);
  auVar39 = vaddpd_avx512f(auVar39,auVar41);
  auVar41 = vmulpd_avx512f(auVar38,local_2600._64_64_);
  auVar42 = vmulpd_avx512f(auVar40,local_1300);
  auVar41 = vaddpd_avx512f(auVar41,auVar42);
  auVar38 = vmulpd_avx512f(auVar38,_local_2580);
  auVar40 = vmulpd_avx512f(auVar40,local_12c0);
  auVar38 = vaddpd_avx512f(auVar38,auVar40);
  auVar46 = auVar39._0_16_;
  auVar37 = vshufpd_avx(auVar46,auVar46,1);
  auVar47 = auVar39._16_16_;
  auVar3 = vshufpd_avx(auVar47,auVar47,1);
  auVar24 = vextractf32x4_avx512f(auVar39,2);
  auVar44 = vshufpd_avx(auVar24,auVar24,1);
  auVar25 = vextractf32x4_avx512f(auVar39,3);
  auVar45 = vshufpd_avx(auVar25,auVar25,1);
  auVar48 = auVar41._0_16_;
  auVar4 = vshufpd_avx(auVar48,auVar48,1);
  auVar49 = auVar41._16_16_;
  auVar5 = vshufpd_avx(auVar49,auVar49,1);
  auVar26 = vextractf32x4_avx512f(auVar41,2);
  auVar6 = vshufpd_avx(auVar26,auVar26,1);
  auVar27 = vextractf32x4_avx512f(auVar41,3);
  auVar28 = vshufpd_avx512vl(auVar27,auVar27,1);
  auVar50 = auVar38._0_16_;
  auVar29 = vshufpd_avx512vl(auVar50,auVar50,1);
  auVar30 = vextractf32x4_avx512vl(auVar38._0_32_,1);
  auVar31 = vshufpd_avx512vl(auVar30,auVar30,1);
  auVar32 = vextractf32x4_avx512f(auVar38,2);
  auVar33 = vshufpd_avx512vl(auVar32,auVar32,1);
  auVar34 = vextractf32x4_avx512f(auVar38,3);
  auVar35 = vshufpd_avx512vl(auVar34,auVar34,1);
  pdVar7 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.
           m_data.array + 2;
  pdVar8 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.
           m_data.array + 5;
  pdVar9 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.
           m_data.array + 8;
  lVar11 = 0;
  do {
    uVar10 = *(ulong *)(local_2600 + lVar11 * 8);
    uVar16 = *(ulong *)(local_2600 + lVar11 * 8 + 0x40);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar10;
    auVar36 = vmulsd_avx512f(auVar46,auVar56);
    vmovsd_avx512f(auVar36);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar16;
    auVar36 = vmulsd_avx512f(auVar46,auVar51);
    vmovsd_avx512f(auVar36);
    uVar23 = *(ulong *)(local_2580 + lVar11 * 8);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar23;
    auVar36 = vmulsd_avx512f(auVar46,auVar60);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar37,auVar56);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar37,auVar51);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar37,auVar60);
    vmovsd_avx512f(auVar36);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar10;
    auVar36 = vmulsd_avx512f(auVar47,auVar57);
    vmovsd_avx512f(auVar36);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar16;
    auVar36 = vmulsd_avx512f(auVar47,auVar52);
    vmovsd_avx512f(auVar36);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar23;
    auVar36 = vmulsd_avx512f(auVar47,auVar61);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar3,auVar57);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar3,auVar52);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar3,auVar61);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar24,auVar57);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar24,auVar52);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar24,auVar61);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar44,auVar57);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar44,auVar52);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar44,auVar61);
    vmovsd_avx512f(auVar36);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar10;
    auVar36 = vmulsd_avx512f(auVar25,auVar58);
    vmovsd_avx512f(auVar36);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar16;
    auVar36 = vmulsd_avx512f(auVar25,auVar53);
    vmovsd_avx512f(auVar36);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar23;
    auVar36 = vmulsd_avx512f(auVar25,auVar62);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar45,auVar58);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar45,auVar53);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar45,auVar62);
    vmovsd_avx512f(auVar36);
    lVar15 = 0x10;
    pdVar18 = pdVar7;
    do {
      dVar43 = *(double *)(local_2580 + lVar15 + 0x38);
      ((plain_array<double,_576,_0,_64> *)(pdVar18 + -2))->array[0] =
           *(double *)(local_2580 + lVar15 + 0x30);
      pdVar18[-1] = dVar43;
      auVar36._8_8_ = 0;
      auVar36._0_8_ =
           *(ulong *)((long)local_2540.
                            super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage
                            .m_data.array + lVar15);
      vmovsd_avx512f(auVar36);
      *pdVar18 = *pdVar18;
      lVar15 = lVar15 + 0x18;
      pdVar18 = pdVar18 + 9;
    } while (lVar15 != 0xd0);
    auVar36 = vmulsd_avx512f(auVar48,auVar58);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar48,auVar53);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar48,auVar62);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar4,auVar58);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar4,auVar53);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar4,auVar62);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar49,auVar58);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar49,auVar53);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar49,auVar62);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar5,auVar58);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar5,auVar53);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar5,auVar62);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar26,auVar58);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar26,auVar53);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar26,auVar62);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar6,auVar58);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar6,auVar53);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar6,auVar62);
    vmovsd_avx512f(auVar36);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar10;
    auVar36 = vmulsd_avx512f(auVar27,auVar59);
    vmovsd_avx512f(auVar36);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar16;
    auVar36 = vmulsd_avx512f(auVar27,auVar54);
    vmovsd_avx512f(auVar36);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar23;
    auVar36 = vmulsd_avx512f(auVar27,auVar63);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar28,auVar59);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar28,auVar54);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar28,auVar63);
    vmovsd_avx512f(auVar36);
    lVar15 = 0x10;
    pdVar18 = pdVar8;
    do {
      dVar43 = *(double *)(local_2580 + lVar15 + 0x38);
      pdVar18[-2] = *(double *)(local_2580 + lVar15 + 0x30);
      pdVar18[-1] = dVar43;
      auVar64._8_8_ = 0;
      auVar64._0_8_ =
           *(ulong *)((long)local_2540.
                            super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage
                            .m_data.array + lVar15);
      vmovsd_avx512f(auVar64);
      *pdVar18 = *pdVar18;
      lVar15 = lVar15 + 0x18;
      pdVar18 = pdVar18 + 9;
    } while (lVar15 != 0xd0);
    auVar36 = vmulsd_avx512f(auVar50,auVar59);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar50,auVar54);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar50,auVar63);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar29,auVar59);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar29,auVar54);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar29,auVar63);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar30,auVar59);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar30,auVar54);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar30,auVar63);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar31,auVar59);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar31,auVar54);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar31,auVar63);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar32,auVar59);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar32,auVar54);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar32,auVar63);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar33,auVar59);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar33,auVar54);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar33,auVar63);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar34,auVar59);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar34,auVar54);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar34,auVar63);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar35,auVar59);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar35,auVar54);
    vmovsd_avx512f(auVar36);
    auVar36 = vmulsd_avx512f(auVar35,auVar63);
    vmovsd_avx512f(auVar36);
    lVar15 = 0x10;
    pdVar18 = pdVar9;
    do {
      dVar43 = *(double *)(local_2580 + lVar15 + 0x38);
      pdVar18[-2] = *(double *)(local_2580 + lVar15 + 0x30);
      pdVar18[-1] = dVar43;
      auVar55._8_8_ = 0;
      auVar55._0_8_ =
           *(ulong *)((long)local_2540.
                            super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage
                            .m_data.array + lVar15);
      vmovsd_avx512f(auVar55);
      *pdVar18 = *pdVar18;
      lVar15 = lVar15 + 0x18;
      pdVar18 = pdVar18 + 9;
    } while (lVar15 != 0xd0);
    lVar11 = lVar11 + 1;
    pdVar7 = pdVar7 + 0x48;
    pdVar8 = pdVar8 + 0x48;
    pdVar9 = pdVar9 + 0x48;
  } while (lVar11 != 8);
  a_rhs = &this->m_O2;
  local_2800 = (undefined1  [8])&local_1280;
  local_27f0 = a_rhs;
  if ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
      != 0x40) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 64, 0>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 64, 0>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                 );
  }
  if ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      == 0x40) {
    lVar21 = 0;
    memset(&local_2540,0,0x1200);
    local_2920 = 1.0;
    local_2960 = (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_64,_0,_9,_64>_>
                  *)local_2800;
    Eigen::internal::
    generic_product_impl<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,9,64,0,9,64>const>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,9,64,0,9,64>>(&local_2540,local_2960,a_rhs,&local_2920);
    lVar11 = 8;
    lVar15 = 0x10;
    pdVar7 = local_2540.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.
             m_data.array + 8;
    lVar12 = 0;
    do {
      lVar14 = (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).m_stride.m_outer.m_value;
      pdVar1 = (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
      lVar2 = (H->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value;
      lVar19 = lVar14 * lVar21;
      lVar20 = lVar14 * lVar11;
      lVar14 = lVar14 * lVar15;
      lVar22 = 2;
      pdVar8 = pdVar7;
      do {
        if ((lVar2 < lVar12 * 3 + 3) ||
           ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar22 + -2)) {
LAB_0072c641:
          __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                        "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                       );
        }
        *(double *)((long)pdVar1 + lVar22 * 8 + lVar19 + -0x10) =
             ((plain_array<double,_576,_0,_64> *)(pdVar8 + -8))->array[0];
        *(double *)((long)pdVar1 + lVar22 * 8 + lVar20 + -0x10) = pdVar8[-7];
        *(double *)((long)pdVar1 + lVar22 * 8 + lVar14 + -0x10) = pdVar8[-6];
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar22 + -1) goto LAB_0072c641;
        *(double *)((long)pdVar1 + lVar22 * 8 + lVar19 + -8) = pdVar8[-5];
        *(double *)((long)pdVar1 + lVar22 * 8 + lVar20 + -8) = pdVar8[-4];
        *(double *)((long)pdVar1 + lVar22 * 8 + lVar14 + -8) = pdVar8[-3];
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar22) goto LAB_0072c641;
        *(double *)((long)pdVar1 + lVar22 * 8 + lVar19) = pdVar8[-2];
        *(double *)((long)pdVar1 + lVar22 * 8 + lVar20) = pdVar8[-1];
        *(double *)((long)pdVar1 + lVar22 * 8 + lVar14) = *pdVar8;
        lVar22 = lVar22 + 3;
        pdVar8 = pdVar8 + 0x48;
      } while (lVar22 != 0x1a);
      lVar12 = lVar12 + 1;
      lVar21 = lVar21 + 0x18;
      lVar11 = lVar11 + 0x18;
      lVar15 = lVar15 + 0x18;
      pdVar7 = pdVar7 + 9;
    } while (lVar12 != 8);
    uVar10 = (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    uVar16 = (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    if ((long)(uVar16 | uVar10) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((uVar10 == 8) && (uVar16 == 8)) {
      pdVar7 = (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
               .m_storage.m_data;
      auVar5._8_8_ = in_XMM0_Qb;
      auVar5._0_8_ = Kfactor;
      auVar4._8_8_ = 0x8000000000000000;
      auVar4._0_8_ = 0x8000000000000000;
      auVar37 = vxorpd_avx512vl(auVar5,auVar4);
      lVar11 = 0;
      do {
        dVar43 = auVar37._0_8_;
        *(double *)(local_2800 + lVar11 * 8) = dVar43 * *(double *)((long)pdVar7 + lVar11);
        (&dStack_27f8)[lVar11] = dVar43 * *(double *)((long)pdVar7 + lVar11 + 0x40);
        (&local_27f0)[lVar11] =
             (Matrix<double,__1,__1,_0,__1,__1> *)
             (dVar43 * *(double *)((long)pdVar7 + lVar11 + 0x80));
        adStack_27e8[lVar11] = dVar43 * *(double *)((long)pdVar7 + lVar11 + 0xc0);
        adStack_27e8[lVar11 + 1] = dVar43 * *(double *)((long)pdVar7 + lVar11 + 0x100);
        adStack_27e8[lVar11 + 2] = dVar43 * *(double *)((long)pdVar7 + lVar11 + 0x140);
        adStack_27e8[lVar11 + 3] = dVar43 * *(double *)((long)pdVar7 + lVar11 + 0x180);
        adStack_27e8[lVar11 + 4] = dVar43 * *(double *)((long)pdVar7 + lVar11 + 0x1c0);
        lVar11 = lVar11 + 8;
      } while (lVar11 != 0x40);
      local_2920 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[0];
      dStack_2918 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[1];
      dStack_2910 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[2];
      dStack_2908 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[3];
      local_2900 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[4];
      dStack_28f8 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[5];
      dStack_28f0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[6];
      dStack_28e8 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[7];
      local_28e0 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[8];
      dStack_28d8 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[9];
      dStack_28d0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[10];
      dStack_28c8 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0xb];
      local_28c0 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[0xc];
      dStack_28b8 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0xd];
      dStack_28b0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0xe];
      dStack_28a8 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0xf];
      local_28a0 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[0x10];
      dStack_2898 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x11];
      dStack_2890 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x12];
      dStack_2888 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x13];
      local_2880 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[0x14];
      dStack_2878 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x15];
      dStack_2870 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x16];
      dStack_2868 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x17];
      local_2860 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[0x18];
      dStack_2858 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x19];
      dStack_2850 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x1a];
      dStack_2848 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x1b];
      local_2840 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[0x1c];
      dStack_2838 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x1d];
      dStack_2830 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x1e];
      dStack_2828 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x1f];
      local_2820 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[0x20];
      dStack_2818 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x21];
      dStack_2810 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x22];
      dStack_2808 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x23];
      lVar11 = 0x10;
      lVar12 = 8;
      lVar15 = -0xfffffff2;
      uVar10 = 0;
      lVar21 = 0;
      uVar16 = 0;
      do {
        pdVar1 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_data;
        lVar14 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value;
        lVar2 = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value;
        lVar19 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        iVar13 = 8;
        lVar20 = 2;
        uVar23 = 0;
        do {
          if (uVar23 < uVar16) {
            uVar17 = (((int)uVar23 + -7) * iVar13 + 0x38U >> 1) + (int)uVar16;
          }
          else {
            uVar17 = ((uint)(uVar10 >> 1) & 0x7fffffff) + (int)uVar23;
          }
          if (0x23 < uVar17) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 36, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 36, 1>, Level = 1]"
                         );
          }
          if ((lVar14 <= (long)(uVar16 * 3)) || (lVar2 <= lVar20 + -2)) {
LAB_0072c660:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                         );
          }
          dVar43 = (&local_2920)[uVar17] + (double)(&local_2960->m_xpr)[uVar23];
          *(double *)((long)pdVar1 + lVar20 * 8 + lVar19 * lVar21 + -0x10) =
               dVar43 + *(double *)((long)pdVar1 + lVar20 * 8 + lVar19 * lVar21 + -0x10);
          if ((lVar14 <= (long)(uVar16 * 3 + 1)) ||
             (((lVar2 <= lVar20 + -1 ||
               (*(double *)((long)pdVar1 + lVar20 * 8 + lVar19 * lVar12 + -8) =
                     dVar43 + *(double *)((long)pdVar1 + lVar20 * 8 + lVar19 * lVar12 + -8),
               lVar14 <= (long)(uVar16 * 3 + 2))) || (lVar2 <= lVar20)))) goto LAB_0072c660;
          *(double *)((long)pdVar1 + lVar20 * 8 + lVar19 * lVar11) =
               dVar43 + *(double *)((long)pdVar1 + lVar20 * 8 + lVar19 * lVar11);
          uVar23 = uVar23 + 1;
          iVar13 = iVar13 + -1;
          lVar20 = lVar20 + 3;
        } while (lVar20 != 0x1a);
        uVar16 = uVar16 + 1;
        lVar11 = lVar11 + 0x18;
        lVar12 = lVar12 + 0x18;
        lVar21 = lVar21 + 0x18;
        local_2960 = local_2960 + 4;
        uVar10 = uVar10 + lVar15;
        lVar15 = lVar15 + -2;
        if (uVar16 == 8) {
          return;
        }
      } while( true );
    }
    __function = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 8, 8, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 8, 8, 1>]"
    ;
  }
  else {
    __function = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 9, 64, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 9, 64, 0>]"
    ;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,__function);
}

Assistant:

void ChElementBeamANCF_3243::ComputeInternalJacobianPreInt(ChMatrixRef& H,
                                                           double Kfactor,
                                                           double Rfactor,
                                                           double Mfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Pre-Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // components of the generalized internal force vector and its Jacobian that need to be integrated across the volume
    // are calculated once prior to the start of the simulation.  Since computationally expensive quantities are
    // required for both the generalized internal force vector and its Jacobian, these values were cached for reuse
    // during this Jacobian calculation.

    Matrix3xN e_bar;
    Matrix3xN e_bar_dot;

    CalcCoordMatrix(e_bar);
    CalcCoordDerivMatrix(e_bar_dot);

    // Build the [9 x NSF^2] matrix containing the combined scaled nodal coordinates and their time derivatives.
    Matrix3xN temp = (Kfactor + m_Alpha * Rfactor) * e_bar + (m_Alpha * Kfactor) * e_bar_dot;
    ChMatrixNM<double, 1, NSF> tempRow0 = temp.template block<1, NSF>(0, 0);
    ChMatrixNM<double, 1, NSF> tempRow1 = temp.template block<1, NSF>(1, 0);
    ChMatrixNM<double, 1, NSF> tempRow2 = temp.template block<1, NSF>(2, 0);
    ChMatrixNMc<double, 9, NSF * NSF> PI2;

    for (unsigned int v = 0; v < NSF; v++) {
        PI2.template block<3, NSF>(0, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow0;
        PI2.template block<3, NSF>(3, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow1;
        PI2.template block<3, NSF>(6, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow2;
    }

    // Calculate the matrix containing the dense part of the Jacobian matrix in a reordered form. This is then reordered
    // from its [9 x NSF^2] form into its required [3*NSF x 3*NSF] form
    ChMatrixNMc<double, 9, NSF* NSF> K2 = -PI2 * m_O2;

    for (unsigned int k = 0; k < NSF; k++) {
        for (unsigned int f = 0; f < NSF; f++) {
            H.block<3, 1>(3 * k, 3 * f) = K2.template block<3, 1>(0, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 1) = K2.template block<3, 1>(3, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 2) = K2.template block<3, 1>(6, NSF * f + k);
        }
    }

    // Add in the sparse (blocks times the 3x3 identity matrix) component of the Jacobian that was already calculated as
    // part of the generalized internal force calculations as well as the Mass Matrix which is stored in compact upper
    // triangular form
    MatrixNxN K_K13Compact = -Kfactor * m_K13Compact;
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;

    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = 0; j < NSF; j++) {
            unsigned int idx;
            // Convert from a (i,j) index to a linear index into the Mass Matrix in Compact Upper Triangular Form
            // https://math.stackexchange.com/questions/2134011/conversion-of-upper-triangle-linear-index-from-index-on-symmetrical-array
            if (j >= i) {
                idx = (NSF * (NSF - 1) - (NSF - i) * (NSF - i - 1)) / 2 + j;
            } else {
                idx = (NSF * (NSF - 1) - (NSF - j) * (NSF - j - 1)) / 2 + i;
            }

            double d = ScaledMassMatrix(idx) + K_K13Compact(i, j);
            H(3 * i, 3 * j) += d;
            H(3 * i + 1, 3 * j + 1) += d;
            H(3 * i + 2, 3 * j + 2) += d;
        }
    }
}